

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O3

void __thiscall GLFlat::DrawSubsectors(GLFlat *this,int pass,bool processlights,bool istrans)

{
  uint uVar1;
  subsector_t *psVar2;
  sector_t *psVar3;
  FDrawInfo *pFVar4;
  subsector_t *psVar5;
  long *plVar6;
  DWORD DVar7;
  long lVar8;
  int index;
  int iVar9;
  int dli;
  int local_34;
  
  FRenderState::Apply(&gl_RenderState);
  iVar9 = this->vboindex;
  psVar3 = this->sector;
  if (iVar9 < 0) {
    if (0 < psVar3->subsectorcount) {
      lVar8 = 0;
      pFVar4 = gl_drawinfo;
      psVar5 = subsectors;
      do {
        psVar2 = psVar3->subsectors[lVar8];
        if (((pFVar4->ss_renderflags).Array
             [((long)psVar2 - (long)psVar5 >> 5) * -0x5555555555555555] & this->renderflags) != 0 ||
            istrans) {
          if (processlights) {
            SetupSubsectorLights(this,0,psVar2,&local_34);
          }
          DrawSubsector(this,psVar2);
          psVar3 = this->sector;
          pFVar4 = gl_drawinfo;
          psVar5 = subsectors;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < psVar3->subsectorcount);
    }
  }
  else if (0 < psVar3->subsectorcount) {
    lVar8 = 0;
    pFVar4 = gl_drawinfo;
    psVar5 = subsectors;
    do {
      psVar2 = psVar3->subsectors[lVar8];
      if (((pFVar4->ss_renderflags).Array[((long)psVar2 - (long)psVar5 >> 5) * -0x5555555555555555]
          & this->renderflags) == 0 && !istrans) {
        DVar7 = psVar2->numlines;
      }
      else {
        if (processlights) {
          SetupSubsectorLights(this,0,psVar2,&local_34);
        }
        (*_ptrc_glDrawArrays)(6,iVar9,psVar2->numlines);
        DVar7 = psVar2->numlines;
        flatvertices = flatvertices + DVar7;
        flatprimitives = flatprimitives + 1;
        psVar3 = this->sector;
        pFVar4 = gl_drawinfo;
        psVar5 = subsectors;
      }
      iVar9 = iVar9 + DVar7;
      lVar8 = lVar8 + 1;
    } while (lVar8 < psVar3->subsectorcount);
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      lVar8 = 0x98;
      uVar1 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar8 = 0x88;
      uVar1 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if (((uint)psVar3->sectornum < uVar1) &&
       (plVar6 = *(long **)(*(long *)(&gl_drawinfo->temporary + lVar8) +
                           (ulong)(uint)psVar3->sectornum * 8), plVar6 != (long *)0x0)) {
      do {
        if (processlights) {
          SetupSubsectorLights(this,0,(subsector_t *)plVar6[1],&local_34);
        }
        DrawSubsector(this,(subsector_t *)plVar6[1]);
        plVar6 = (long *)*plVar6;
      } while (plVar6 != (long *)0x0);
    }
  }
  return;
}

Assistant:

void GLFlat::DrawSubsectors(int pass, bool processlights, bool istrans)
{
	int dli = dynlightindex;

	gl_RenderState.Apply();
	if (vboindex >= 0)
	{
		int index = vboindex;
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
				
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				drawcalls.Clock();
				glDrawArrays(GL_TRIANGLE_FAN, index, sub->numlines);
				drawcalls.Unclock();
				flatvertices += sub->numlines;
				flatprimitives++;
			}
			index += sub->numlines;
		}
	}
	else
	{
		// Draw the subsectors belonging to this sector
		// (can this case even happen?)
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				DrawSubsector(sub);
			}
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			if (processlights) SetupSubsectorLights(GLPASS_ALL, node->sub, &dli);
			DrawSubsector(node->sub);
			node = node->next;
		}
	}
}